

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O1

int sf_parser_param(sf_parser *sfp,sf_vec *dest_key,sf_value *dest_value)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  
  switch(sfp->state & 3) {
  case 0:
    iVar2 = parser_skip_inner_list(sfp);
    if (iVar2 == 0) goto switchD_00117af0_caseD_1;
    break;
  case 1:
switchD_00117af0_caseD_1:
    sfp->state = sfp->state & 0xfffffffc | 2;
  case 2:
    puVar3 = sfp->pos;
    puVar1 = sfp->end;
    if ((puVar3 == puVar1) || (*puVar3 != ';')) {
      *(byte *)&sfp->state = (byte)sfp->state | 3;
      iVar2 = -2;
    }
    else {
      do {
        puVar3 = puVar3 + 1;
        sfp->pos = puVar3;
        if (puVar3 == puVar1) break;
      } while (*puVar3 == ' ');
      iVar2 = -1;
      if ((sfp->pos != puVar1) && (iVar2 = parser_key(sfp,dest_key), iVar2 == 0)) {
        puVar3 = sfp->pos;
        if ((puVar3 == sfp->end) || (*puVar3 != '=')) {
          iVar2 = 0;
          if (dest_value != (sf_value *)0x0) {
            dest_value->type = SF_TYPE_BOOLEAN;
            dest_value->flags = 0;
            (dest_value->field_2).boolean = 1;
          }
        }
        else {
          sfp->pos = puVar3 + 1;
          iVar2 = -1;
          if (puVar3 + 1 != sfp->end) {
            iVar2 = parser_bare_item(sfp,dest_value);
            return iVar2;
          }
        }
      }
    }
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x283,"int sf_parser_param(sf_parser *, sf_vec *, sf_value *)");
  }
  return iVar2;
}

Assistant:

int sf_parser_param(sf_parser *sfp, sf_vec *dest_key, sf_value *dest_value) {
  int rv;

  switch (sfp->state & SF_STATE_OP_MASK) {
  case SF_STATE_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_BEFORE_PARAMS:
    parser_set_op_state(sfp, SF_STATE_PARAMS);

    break;
  case SF_STATE_PARAMS:
    break;
  default:
    assert(0);
    abort();
  }

  if (parser_eof(sfp) || *sfp->pos != ';') {
    parser_set_op_state(sfp, SF_STATE_AFTER);

    return SF_ERR_EOF;
  }

  ++sfp->pos;

  parser_discard_sp(sfp);
  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  rv = parser_key(sfp, dest_key);
  if (rv != 0) {
    return rv;
  }

  if (parser_eof(sfp) || *sfp->pos != '=') {
    if (dest_value) {
      dest_value->type = SF_TYPE_BOOLEAN;
      dest_value->flags = SF_VALUE_FLAG_NONE;
      dest_value->boolean = 1;
    }

    return 0;
  }

  ++sfp->pos;

  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  return parser_bare_item(sfp, dest_value);
}